

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uint llvm::detail::PopulationCounter<unsigned_long,_8UL>::count(unsigned_long Value)

{
  ulong uVar1;
  unsigned_long Value_local;
  
  uVar1 = Value - (Value >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  return (uint)(byte)((uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
}

Assistant:

static unsigned count(T Value) {
#if __GNUC__ >= 4
    return __builtin_popcountll(Value);
#else
    uint64_t v = Value;
    v = v - ((v >> 1) & 0x5555555555555555ULL);
    v = (v & 0x3333333333333333ULL) + ((v >> 2) & 0x3333333333333333ULL);
    v = (v + (v >> 4)) & 0x0F0F0F0F0F0F0F0FULL;
    return unsigned((uint64_t)(v * 0x0101010101010101ULL) >> 56);
#endif
  }